

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7Dec.c
# Opt level: O0

UInt32 Range_DecodeBit(void *pp,UInt32 size0)

{
  uint uVar1;
  int in_ESI;
  long in_RDI;
  bool bVar2;
  UInt32 symbol;
  UInt32 newBound;
  CPpmd7z_RangeDec *p;
  UInt32 UVar3;
  
  uVar1 = (*(uint *)(in_RDI + 0x18) >> 0xe) * in_ESI;
  bVar2 = uVar1 <= *(uint *)(in_RDI + 0x1c);
  if (bVar2) {
    *(uint *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) - uVar1;
    *(uint *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) - uVar1;
  }
  else {
    *(uint *)(in_RDI + 0x18) = uVar1;
  }
  UVar3 = (UInt32)bVar2;
  Range_Normalize((CPpmd7z_RangeDec *)CONCAT44(uVar1,UVar3));
  return UVar3;
}

Assistant:

static UInt32 Range_DecodeBit(void *pp, UInt32 size0)
{
  CPpmd7z_RangeDec *p = (CPpmd7z_RangeDec *)pp;
  UInt32 newBound = (p->Range >> 14) * size0;
  UInt32 symbol;
  if (p->Code < newBound)
  {
    symbol = 0;
    p->Range = newBound;
  }
  else
  {
    symbol = 1;
    p->Code -= newBound;
    p->Range -= newBound;
  }
  Range_Normalize(p);
  return symbol;
}